

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Float pbrt::SampleLinear(Float u,Float a,Float b)

{
  undefined1 auVar1 [16];
  float fVar2;
  
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(b * b * u)),ZEXT416((uint)(a * a)),
                           ZEXT416((uint)(1.0 - u)));
  if (auVar1._0_4_ < 0.0) {
    fVar2 = sqrtf(auVar1._0_4_);
  }
  else {
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    fVar2 = auVar1._0_4_;
  }
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(((a + b) * u) / (fVar2 + a))));
  return auVar1._0_4_;
}

Assistant:

PBRT_CPU_GPU
inline Float SampleLinear(Float u, Float a, Float b) {
    DCHECK(a >= 0 && b >= 0);
    Float x = u * (a + b) / (a + std::sqrt(Lerp(u, Sqr(a), Sqr(b))));
    return std::min(x, OneMinusEpsilon);
}